

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall
Storage::Disk::Drive::Drive
          (Drive *this,int input_clock_rate,int revolutions_per_minute,int number_of_heads,
          ReadyType rdy_type)

{
  result_type rVar1;
  result_type rVar2;
  result_type rVar3;
  result_type rVar4;
  int local_5c;
  int bit;
  result_type half_range;
  default_random_engine randomiser;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  result_type local_38;
  result_type seed;
  ReadyType local_20;
  int local_1c;
  ReadyType rdy_type_local;
  int number_of_heads_local;
  int revolutions_per_minute_local;
  int input_clock_rate_local;
  Drive *this_local;
  
  local_20 = rdy_type;
  local_1c = number_of_heads;
  rdy_type_local = revolutions_per_minute;
  number_of_heads_local = input_clock_rate;
  _revolutions_per_minute_local = this;
  ClockingHint::Source::Source(&this->super_Source);
  TimedEventLoop::TimedEventLoop(&this->super_TimedEventLoop,(long)number_of_heads_local);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_00caa8a0;
  (this->super_TimedEventLoop)._vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_00caa8e8
  ;
  Event::Event((Event *)&(this->super_TimedEventLoop).field_0x1c);
  std::shared_ptr<Storage::Disk::Disk>::shared_ptr(&this->disk_);
  std::shared_ptr<Storage::Disk::Track>::shared_ptr(&this->track_);
  this->has_disk_ = false;
  this->rotational_multiplier_ = 1.0;
  this->cycles_since_index_hole_ = 0;
  this->cycles_per_revolution_ = 1;
  HeadPosition::HeadPosition(&this->head_position_);
  this->head_ = 0;
  this->available_heads_ = local_1c;
  this->motor_input_is_on_ = false;
  this->disk_is_rotating_ = false;
  Cycles::Cycles(&this->time_until_motor_transition);
  Cycles::Cycles(&this->index_pulse_remaining_);
  this->is_reading_ = true;
  this->clamp_writing_to_index_hole_ = false;
  std::shared_ptr<Storage::Disk::PCMTrack>::shared_ptr(&this->patched_track_);
  PCMSegment::PCMSegment(&this->write_segment_);
  Time::Time(&this->write_start_time_);
  this->ready_index_count_ = 0;
  this->ready_type_ = local_20;
  this->is_ready_ = false;
  Time::Time(&this->cycles_until_bits_written_);
  Time::Time(&this->cycles_per_bit_);
  this->event_delegate_ = (EventDelegate *)0x0;
  this->observer_ = (Observer *)0x0;
  std::__cxx11::string::string((string *)&this->drive_name_);
  this->announce_motor_led_ = false;
  set_rotation_speed(this,(float)(int)rdy_type_local);
  randomiser._M_x = std::chrono::_V2::system_clock::now();
  local_40.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&randomiser);
  local_38 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_40);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&half_range,
             local_38);
  this->random_source_ = 0;
  rVar1 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::max();
  rVar2 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::min();
  for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 1) {
    this->random_source_ = this->random_source_ * 2;
    rVar3 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                      ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &half_range);
    rVar4 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::min();
    this->random_source_ =
         (long)(int)(uint)(rVar1 - rVar2 >> 1 <= rVar3 - rVar4) | this->random_source_;
  }
  return;
}

Assistant:

Drive::Drive(int input_clock_rate, int revolutions_per_minute, int number_of_heads, ReadyType rdy_type):
	Storage::TimedEventLoop(input_clock_rate),
	available_heads_(number_of_heads),
	ready_type_(rdy_type) {
	set_rotation_speed(revolutions_per_minute);

	const auto seed = std::default_random_engine::result_type(std::chrono::system_clock::now().time_since_epoch().count());
	std::default_random_engine randomiser(seed);

	// Get at least 64 bits of random information; rounding is likey to give this a slight bias.
	random_source_ = 0;
	auto half_range = (randomiser.max() - randomiser.min()) / 2;
	for(int bit = 0; bit < 64; ++bit) {
		random_source_ <<= 1;
		random_source_ |= ((randomiser() - randomiser.min()) >= half_range) ? 1 : 0;
	}
}